

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_sse4.h
# Opt level: O0

__m128i blend_16_u8(uint8_t *src0,uint8_t *src1,__m128i *v_m0_b,__m128i *v_m1_b,__m128i *rounding)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  void *in_RSI;
  void *in_RDI;
  undefined1 (*in_R8) [16];
  undefined8 in_XMM0_Qa;
  undefined8 uVar5;
  undefined8 in_XMM0_Qb;
  undefined8 uVar6;
  __m128i alVar7;
  __m128i v_res;
  __m128i v_res1_w;
  __m128i v_res0_w;
  __m128i v_p1_w;
  __m128i v_p0_w;
  __m128i v_s1_b;
  __m128i v_s0_b;
  
  xx_loadu_128(in_RDI);
  uVar5 = in_XMM0_Qa;
  uVar6 = in_XMM0_Qb;
  alVar7 = xx_loadu_128(in_RSI);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar2._8_8_ = uVar6;
  auVar2._0_8_ = uVar5;
  auVar2 = vpunpcklbw_avx(auVar3,auVar2);
  auVar3 = vpunpcklbw_avx(*in_RDX,*in_RCX);
  auVar2 = vpmaddubsw_avx(auVar2,auVar3);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar1._8_8_ = uVar6;
  auVar1._0_8_ = uVar5;
  auVar3 = vpunpckhbw_avx(auVar4,auVar1);
  auVar1 = vpunpckhbw_avx(*in_RDX,*in_RCX);
  auVar3 = vpmaddubsw_avx(auVar3,auVar1);
  auVar2 = vpmulhrsw_avx(auVar2,*in_R8);
  auVar3 = vpmulhrsw_avx(auVar3,*in_R8);
  vpackuswb_avx(auVar2,auVar3);
  alVar7[0] = (longlong)in_R8;
  return alVar7;
}

Assistant:

static inline __m128i blend_16_u8(const uint8_t *src0, const uint8_t *src1,
                                  const __m128i *v_m0_b, const __m128i *v_m1_b,
                                  const __m128i *rounding) {
  const __m128i v_s0_b = xx_loadu_128(src0);
  const __m128i v_s1_b = xx_loadu_128(src1);

  const __m128i v_p0_w = _mm_maddubs_epi16(_mm_unpacklo_epi8(v_s0_b, v_s1_b),
                                           _mm_unpacklo_epi8(*v_m0_b, *v_m1_b));
  const __m128i v_p1_w = _mm_maddubs_epi16(_mm_unpackhi_epi8(v_s0_b, v_s1_b),
                                           _mm_unpackhi_epi8(*v_m0_b, *v_m1_b));

  const __m128i v_res0_w = _mm_mulhrs_epi16(v_p0_w, *rounding);
  const __m128i v_res1_w = _mm_mulhrs_epi16(v_p1_w, *rounding);
  const __m128i v_res = _mm_packus_epi16(v_res0_w, v_res1_w);
  return v_res;
}